

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qht.c
# Opt level: O1

void qht_map_iter__all_locked(uc_struct_conflict5 *uc,qht_map *map,qht_iter *iter,void *userp)

{
  void **ppvVar1;
  qht_iter_type qVar2;
  uc_struct_conflict5 *puVar3;
  bool bVar4;
  qht_bucket *pqVar5;
  char cVar6;
  void **ppvVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  void **ppvVar10;
  qht_bucket *pqVar11;
  qht_bucket *pqVar12;
  ulong uVar13;
  qht_bucket *pqVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  
  if (map->n_buckets != 0) {
    uVar13 = 0;
    do {
      pqVar12 = map->buckets + uVar13;
      do {
        iVar17 = 0;
        do {
          puVar3 = (uc_struct_conflict5 *)pqVar12->pointers[iVar17];
          if (puVar3 == (uc_struct_conflict5 *)0x0) goto LAB_00d5eda4;
          qVar2 = iter->type;
          if (qVar2 == QHT_ITER_RM) {
            cVar6 = (*(iter->f).retvoid)
                              (puVar3,(void *)(ulong)pqVar12->hashes[iVar17],(uint32_t)userp,
                               (void *)(ulong)qVar2);
            if (cVar6 != '\0') {
              ppvVar1 = pqVar12->pointers + iVar17;
              puVar8 = pqVar12->hashes + iVar17;
              ppvVar7 = ppvVar1;
              puVar9 = puVar8;
              if (iVar17 == 3) {
                if (pqVar12->next != (qht_bucket *)0x0) {
                  ppvVar10 = pqVar12->next->pointers;
                  goto LAB_00d5ed0d;
                }
              }
              else {
                ppvVar10 = pqVar12->pointers + (long)iVar17 + 1;
LAB_00d5ed0d:
                if (*ppvVar10 != (void *)0x0) {
                  pqVar11 = (qht_bucket *)0x0;
                  pqVar5 = pqVar12;
                  do {
                    pqVar14 = pqVar5;
                    lVar16 = 0;
                    do {
                      if (pqVar14->pointers[lVar16] == (void *)0x0) {
                        if (lVar16 == 0) {
                          ppvVar7 = pqVar11->pointers + 3;
                          puVar9 = pqVar11->hashes + 3;
                        }
                        else {
                          uVar15 = (int)lVar16 - 1;
                          ppvVar7 = pqVar14->pointers + uVar15;
                          puVar9 = pqVar14->hashes + uVar15;
                        }
                        goto LAB_00d5ed66;
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                    pqVar11 = pqVar14;
                    pqVar5 = pqVar14->next;
                  } while (pqVar14->next != (qht_bucket *)0x0);
                  ppvVar7 = pqVar14->pointers + 3;
                  puVar9 = pqVar14->hashes + 3;
LAB_00d5ed66:
                  *puVar8 = *puVar9;
                  *ppvVar1 = *ppvVar7;
                }
              }
              *puVar9 = 0;
              *ppvVar7 = (void *)0x0;
              iVar17 = iVar17 + -1;
            }
          }
          else {
            if (qVar2 != QHT_ITER_VOID) {
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/util/qht.c"
                         ,0x251,(char *)0x0);
            }
            (*(iter->f).retvoid)(uc,puVar3,pqVar12->hashes[iVar17],userp);
          }
          bVar4 = iVar17 < 3;
          iVar17 = iVar17 + 1;
        } while (bVar4);
        pqVar12 = pqVar12->next;
      } while (pqVar12 != (qht_bucket *)0x0);
LAB_00d5eda4:
      uVar13 = uVar13 + 1;
    } while (uVar13 < map->n_buckets);
  }
  return;
}

Assistant:

static inline void qht_map_iter__all_locked(struct uc_struct *uc, struct qht_map *map,
                                            const struct qht_iter *iter,
                                            void *userp)
{
    size_t i;

    for (i = 0; i < map->n_buckets; i++) {
        qht_bucket_iter(uc, &map->buckets[i], iter, userp);
    }
}